

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_CTX_set_max_send_fragment(SSL_CTX *ctx,size_t max_send_fragment)

{
  ulong uVar1;
  
  uVar1 = 0x200;
  if (0x200 < max_send_fragment) {
    uVar1 = max_send_fragment;
  }
  if (0x3fff < uVar1) {
    uVar1 = 0x4000;
  }
  ctx->max_send_fragment = (uint16_t)uVar1;
  return 1;
}

Assistant:

int SSL_CTX_set_max_send_fragment(SSL_CTX *ctx, size_t max_send_fragment) {
  if (max_send_fragment < 512) {
    max_send_fragment = 512;
  }
  if (max_send_fragment > SSL3_RT_MAX_PLAIN_LENGTH) {
    max_send_fragment = SSL3_RT_MAX_PLAIN_LENGTH;
  }
  ctx->max_send_fragment = (uint16_t)max_send_fragment;

  return 1;
}